

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfcFlash.cpp
# Opt level: O2

void __thiscall EfcFlash::writePage(EfcFlash *this,uint32_t page)

{
  WordCopyApplet *this_00;
  bool *pbVar1;
  uint uVar2;
  undefined8 *puVar3;
  
  if ((this->super_Flash)._pages <= page) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = &PTR__exception_001177a0;
    __cxa_throw(puVar3,&FlashPageError::typeinfo,std::exception::~exception);
  }
  this_00 = &(this->super_Flash)._wordCopy;
  WordCopyApplet::setDstAddr(this_00,(this->super_Flash)._size * page + (this->super_Flash)._addr);
  WordCopyApplet::setSrcAddr
            (this_00,(&(this->super_Flash)._pageBufferA)[(this->super_Flash)._onBufferA ^ 1]);
  pbVar1 = &(this->super_Flash)._onBufferA;
  *pbVar1 = (bool)(*pbVar1 ^ 1);
  waitFSR(this,1);
  Applet::run(&this_00->super_Applet);
  if (((this->super_Flash)._planes == 2) && (uVar2 = (this->super_Flash)._pages >> 1, uVar2 <= page)
     ) {
    writeFCR1(this,'\x01',page - uVar2);
    return;
  }
  writeFCR0(this,'\x01',page);
  return;
}

Assistant:

void
EfcFlash::writePage(uint32_t page)
{
    if (page >= _pages)
        throw FlashPageError();

    _wordCopy.setDstAddr(_addr + page * _size);
    _wordCopy.setSrcAddr(_onBufferA ? _pageBufferA : _pageBufferB);
    _onBufferA = !_onBufferA;
    waitFSR();
    _wordCopy.run();
    if (_planes == 2 && page >= _pages / 2)
        writeFCR1(EFC_FCMD_WP, page - _pages / 2);
    else
        writeFCR0(EFC_FCMD_WP, page);
}